

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

string * http::Page::HTMLEncode(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  string rc;
  stringstream ss;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar3 = 0;
  do {
    if (str->_M_string_length <= uVar3) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      return __return_storage_ptr__;
    }
    cVar1 = (str->_M_dataplus)._M_p[uVar3];
    pcVar2 = "&gt";
    if (cVar1 == '>') {
LAB_00104a14:
      std::operator<<(local_1a8,pcVar2);
    }
    else {
      if (cVar1 == '<') {
        pcVar2 = "&lt";
        goto LAB_00104a14;
      }
      std::operator<<(local_1a8,cVar1);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string http::Page::HTMLEncode(const std::string& str)
{
    std::string rc;
    std::stringstream ss;
    for (size_t i = 0; i < str.size(); i++)
    {
        switch (str[i])
        {
        case '<': ss << "&lt"; break;

        case '>': ss << "&gt"; break;

        default: ss << str[i]; break;
        }
    }
    return ss.str();
}